

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

int __thiscall deqp::egl::Image::ModifyTests::init(ModifyTests *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  LabeledAction *__lhs;
  Action *pAVar3;
  Action *modify;
  ImageFormatCase *this_00;
  Operation local_158;
  Operation local_148;
  Operation local_138;
  Operation local_128;
  value_type local_114;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  TestSpec spec;
  LabeledAction *modifyAction;
  int modifyNdx;
  LabeledAction *createAction;
  int createNdx;
  allocator<char> local_31;
  string local_30;
  ModifyTests *local_10;
  ModifyTests *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"tex_",&local_31);
  ImageTests::addCreateTexture2DActions(&this->super_ImageTests,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  ImageTests::addCreateRenderbufferActions(&this->super_ImageTests);
  ImageTests::addCreateAndroidNativeActions(&this->super_ImageTests);
  addModifyActions(this);
  for (createAction._0_4_ = 0;
      iVar2 = LabeledActions::size(&(this->super_ImageTests).m_createActions),
      (int)createAction < iVar2; createAction._0_4_ = (int)createAction + 1) {
    __lhs = LabeledActions::operator[](&(this->super_ImageTests).m_createActions,(int)createAction);
    for (modifyAction._4_4_ = 0; iVar2 = LabeledActions::size(&this->m_modifyActions),
        modifyAction._4_4_ < iVar2; modifyAction._4_4_ = modifyAction._4_4_ + 1) {
      spec.operations.
      super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)LabeledActions::operator[](&this->m_modifyActions,modifyAction._4_4_);
      pAVar3 = de::details::
               UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
               operator*(&(__lhs->action).
                          super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                        );
      modify = de::details::
               UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
               operator*((UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                          *)(spec.operations.
                             super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
      bVar1 = isCompatibleCreateAndModifyActions(pAVar3,modify);
      if (bVar1) {
        TestSpec::TestSpec((TestSpec *)local_d0);
        std::operator+(&local_110,&__lhs->label,"_");
        std::operator+(&local_f0,&local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       spec.operations.
                       super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::operator=
                  ((string *)(spec.name.field_2._M_local_buf + 8),"gles2_tex_sub_image");
        local_114 = API_GLES2;
        std::
        vector<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
        ::push_back((vector<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
                     *)((long)&spec.desc.field_2 + 8),&local_114);
        pAVar3 = de::details::
                 UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                 ::operator*(&(__lhs->action).
                              super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                            );
        TestSpec::Operation::Operation(&local_128,0,pAVar3);
        std::
        vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
        ::push_back((vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                     *)&spec.contexts.
                        super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_128);
        TestSpec::Operation::Operation(&local_138,0,(Action *)&this->m_renderAction);
        std::
        vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
        ::push_back((vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                     *)&spec.contexts.
                        super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_138);
        pAVar3 = de::details::
                 UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                 ::operator*((UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                              *)(spec.operations.
                                 super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
        TestSpec::Operation::Operation(&local_148,0,pAVar3);
        std::
        vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
        ::push_back((vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                     *)&spec.contexts.
                        super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_148);
        TestSpec::Operation::Operation(&local_158,0,(Action *)&this->m_renderAction);
        std::
        vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
        ::push_back((vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                     *)&spec.contexts.
                        super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_158);
        this_00 = (ImageFormatCase *)operator_new(0x1bc8);
        ImageFormatCase::ImageFormatCase
                  (this_00,(this->super_ImageTests).super_TestCaseGroup.m_eglTestCtx,
                   (TestSpec *)local_d0);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
        TestSpec::~TestSpec((TestSpec *)local_d0);
      }
    }
  }
  return (int)createAction;
}

Assistant:

void ModifyTests::init (void)
{
	addCreateTexture2DActions("tex_");
	addCreateRenderbufferActions();
	addCreateAndroidNativeActions();
	addModifyActions();

	for (int createNdx = 0; createNdx < m_createActions.size(); createNdx++)
	{
		LabeledAction& createAction = m_createActions[createNdx];

		for (int modifyNdx = 0; modifyNdx < m_modifyActions.size(); modifyNdx++)
		{
			LabeledAction& modifyAction = m_modifyActions[modifyNdx];

			if (!isCompatibleCreateAndModifyActions(*createAction.action, *modifyAction.action))
				continue;

			TestSpec spec;
			spec.name = createAction.label + "_" + modifyAction.label;
			spec.desc = "gles2_tex_sub_image";

			spec.contexts.push_back(TestSpec::API_GLES2);

			spec.operations.push_back(TestSpec::Operation(0, *createAction.action));
			spec.operations.push_back(TestSpec::Operation(0, m_renderAction));
			spec.operations.push_back(TestSpec::Operation(0, *modifyAction.action));
			spec.operations.push_back(TestSpec::Operation(0, m_renderAction));

			addChild(new ImageFormatCase(m_eglTestCtx, spec));
		}
	}
}